

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformfv_invalid_program
               (NegativeTestContext *ctx)

{
  pointer pfVar1;
  reference pvVar2;
  allocator<char> local_61;
  string local_60;
  allocator<float> local_29;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> data;
  NegativeTestContext *ctx_local;
  
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)ctx;
  std::allocator<float>::allocator(&local_29);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,4,&local_29);
  std::allocator<float>::~allocator(&local_29);
  pfVar1 = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_OPERATION is generated if there is no current program object.",&local_61);
  NegativeTestContext::beginSection((NegativeTestContext *)pfVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  glu::CallLogWrapper::glUseProgram
            ((CallLogWrapper *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0);
  pfVar1 = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  glu::CallLogWrapper::glUniform1fv((CallLogWrapper *)pfVar1,-1,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x502);
  pfVar1 = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  glu::CallLogWrapper::glUniform2fv((CallLogWrapper *)pfVar1,-1,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x502);
  pfVar1 = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  glu::CallLogWrapper::glUniform3fv((CallLogWrapper *)pfVar1,-1,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x502);
  pfVar1 = data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  glu::CallLogWrapper::glUniform4fv((CallLogWrapper *)pfVar1,-1,1,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,0x502);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return;
}

Assistant:

void uniformfv_invalid_program (NegativeTestContext& ctx)
{
	std::vector<GLfloat> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if there is no current program object.");
	ctx.glUseProgram(0);
	ctx.glUniform1fv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2fv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3fv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4fv(-1, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}